

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O1

bool __thiscall HighsHessian::operator==(HighsHessian *this,HighsHessian *hessian)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  double *pdVar6;
  int iVar7;
  double *pdVar8;
  size_t sVar9;
  double *pdVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  iVar1 = this->dim_;
  iVar2 = hessian->dim_;
  piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar9 = (long)piVar3 - (long)piVar4;
  piVar5 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (sVar9 == (long)(hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar5) {
    if (piVar3 == piVar4) {
      bVar11 = true;
    }
    else {
      iVar7 = bcmp(piVar4,piVar5,sVar9);
      bVar11 = iVar7 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  piVar3 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar9 = (long)piVar4 - (long)piVar3;
  piVar5 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (sVar9 == (long)(hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar5) {
    if (piVar4 == piVar3) {
      bVar12 = true;
    }
    else {
      iVar7 = bcmp(piVar3,piVar5,sVar9);
      bVar12 = iVar7 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  pdVar8 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar10 = (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)pdVar6 - (long)pdVar8 ==
      (long)(hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar10) {
    bVar13 = pdVar8 == pdVar6;
    if (bVar13) goto LAB_002f7655;
    if ((*pdVar8 == *pdVar10) && (!NAN(*pdVar8) && !NAN(*pdVar10))) {
      do {
        pdVar10 = pdVar10 + 1;
        pdVar8 = pdVar8 + 1;
        bVar13 = pdVar8 == pdVar6;
        if (bVar13) goto LAB_002f7655;
      } while ((*pdVar8 == *pdVar10) && (!NAN(*pdVar8) && !NAN(*pdVar10)));
    }
  }
  bVar13 = false;
LAB_002f7655:
  return (bool)(bVar11 & bVar12 & bVar13 & iVar1 == iVar2);
}

Assistant:

bool HighsHessian::operator==(const HighsHessian& hessian) const {
  bool equal = true;
  equal = this->dim_ == hessian.dim_ && equal;
  equal = this->start_ == hessian.start_ && equal;
  equal = this->index_ == hessian.index_ && equal;
  equal = this->value_ == hessian.value_ && equal;
  return equal;
}